

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.hpp
# Opt level: O1

void __thiscall
ylt::metric::basic_dynamic_summary<2UL>::basic_dynamic_summary
          (basic_dynamic_summary<2UL> *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *quantiles,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name,milliseconds max_age)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  double dVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 *puVar5;
  long *plVar6;
  double *pdVar7;
  double *pdVar8;
  uint uVar9;
  undefined8 uVar10;
  pointer pdVar11;
  double *pdVar12;
  uint uVar13;
  long lVar14;
  long *plVar15;
  double *pdVar16;
  ulong uVar17;
  undefined8 *puVar18;
  allocator_type local_b1;
  string local_b0;
  string local_90;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  local_70;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if (paVar4 == paVar1) {
    local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_90._M_dataplus._M_p = (pointer)paVar4;
  }
  local_90._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(help->_M_dataplus)._M_p;
  paVar1 = &help->field_2;
  if (paVar4 == paVar1) {
    local_b0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&help->field_2 + 8);
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b0._M_dataplus._M_p = (pointer)paVar4;
  }
  local_b0._M_string_length = help->_M_string_length;
  (help->_M_dataplus)._M_p = (pointer)paVar1;
  help->_M_string_length = 0;
  (help->field_2)._M_local_buf[0] = '\0';
  lVar14 = 0x10;
  do {
    puVar18 = (undefined8 *)((long)&local_70._M_elems[0]._M_dataplus._M_p + lVar14);
    puVar2 = (undefined8 *)((long)&labels_name->_M_elems[0]._M_dataplus._M_p + lVar14);
    *(undefined8 **)((long)local_70._M_elems + lVar14 + -0x10) = puVar18;
    puVar5 = *(undefined8 **)((long)labels_name->_M_elems + lVar14 + -0x10);
    if (puVar2 == puVar5) {
      uVar10 = puVar2[1];
      *puVar18 = *puVar2;
      *(undefined8 *)((long)&local_70._M_elems[0]._M_string_length + lVar14) = uVar10;
    }
    else {
      *(undefined8 **)((long)local_70._M_elems + lVar14 + -0x10) = puVar5;
      *puVar18 = *puVar2;
    }
    *(undefined8 *)((long)local_70._M_elems + lVar14 + -8) =
         *(undefined8 *)((long)labels_name->_M_elems + lVar14 + -8);
    *(undefined8 **)((long)labels_name->_M_elems + lVar14 + -0x10) = puVar2;
    *(undefined8 *)((long)labels_name->_M_elems + lVar14 + -8) = 0;
    *(undefined1 *)((long)&labels_name->_M_elems[0]._M_dataplus._M_p + lVar14) = 0;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x50);
  metric_t::metric_t<2ul>((metric_t *)this,Summary,&local_90,&local_b0,&local_70);
  (this->
  super_dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>
  ).super_dynamic_metric.super_metric_t._vptr_metric_t =
       (_func_int **)&PTR__dynamic_metric_impl_002026c8;
  uVar13 = std::thread::hardware_concurrency();
  uVar9 = 0x80;
  if (uVar13 < 0x80) {
    uVar9 = uVar13;
  }
  std::
  vector<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::value_type,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::value_type>_>_>_>,_std::allocator<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::value_type,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::value_type>_>_>_>_>_>
  ::vector(&(this->
            super_dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>
            ).map_.shards_,(ulong)uVar9,&local_b1);
  (this->
  super_dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>
  ).map_.size_.super___atomic_base<long>._M_i = 0;
  lVar14 = 0;
  do {
    plVar6 = *(long **)((long)&local_70._M_elems[1]._M_dataplus._M_p + lVar14);
    plVar15 = (long *)(local_70._M_elems[1].field_2._M_local_buf + lVar14);
    if (plVar15 != plVar6) {
      operator_delete(plVar6,*plVar15 + 1);
    }
    lVar14 = lVar14 + -0x20;
  } while (lVar14 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  (this->
  super_dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>
  ).super_dynamic_metric.super_metric_t._vptr_metric_t =
       (_func_int **)&PTR__basic_dynamic_summary_00202648;
  pdVar11 = (quantiles->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  (this->quantiles_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (quantiles->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->quantiles_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar11;
  (this->quantiles_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (quantiles->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (quantiles->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (quantiles->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (quantiles->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->max_age_).__r = max_age.__r;
  pdVar7 = (this->quantiles_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->quantiles_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar16 = pdVar8;
  pdVar12 = pdVar7;
  if (pdVar7 != pdVar8) {
    do {
      pdVar16 = pdVar12 + 1;
      if (pdVar16 == pdVar8) break;
      dVar3 = *pdVar12;
      pdVar12 = pdVar16;
    } while (dVar3 < *pdVar16 || dVar3 == *pdVar16);
  }
  if (pdVar16 != pdVar8 && pdVar7 != pdVar8) {
    uVar17 = (long)pdVar8 - (long)pdVar7 >> 3;
    lVar14 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar7,pdVar8,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar7,pdVar8);
  }
  return;
}

Assistant:

basic_dynamic_summary(
      std::string name, std::string help, std::vector<double> quantiles,
      std::array<std::string, N> labels_name,
      std::chrono::milliseconds max_age = std::chrono::seconds{60})
      : Base(MetricType::Summary, std::move(name), std::move(help),
             std::move(labels_name)),
        quantiles_(std::move(quantiles)),
        max_age_(max_age) {
    if (!std::is_sorted(quantiles_.begin(), quantiles_.end()))
      std::sort(quantiles_.begin(), quantiles_.end());
  }